

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,
          map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> *m1
          ,map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
           *m2)

{
  int iVar1;
  uint uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  bool bVar5;
  pointer ppVar6;
  wstring *pwVar7;
  undefined8 uVar8;
  bool local_79;
  _Self local_78;
  _Self local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  const_iterator i2;
  const_iterator i1;
  map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> *m2_local;
  map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> *m1_local;
  wstring *strCase_local;
  diff_match_patch_test *this_local;
  
  i2 = std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::
       begin(m1);
  local_38._M_node =
       (_Base_ptr)
       std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::
       begin(m2);
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
         ::end(m1);
    bVar5 = std::operator!=(&i2,&local_40);
    local_79 = false;
    if (bVar5) {
      local_48._M_node =
           (_Base_ptr)
           std::
           map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::
           end(m2);
      local_79 = std::operator!=(&local_38,&local_48);
    }
    if (local_79 == false) {
      local_70._M_node =
           (_Base_ptr)
           std::
           map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::
           end(m1);
      bVar5 = std::operator!=(&i2,&local_70);
      if (bVar5) {
        ResetOutputStream();
        uVar8 = std::__cxx11::wstring::c_str();
        ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&i2);
        wVar4 = ppVar6->first;
        ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&i2);
        wprintf(L"%ls FAIL\nExpected: (%lc, %d)\nActual: none",uVar8,(ulong)(uint)wVar4,
                (ulong)(uint)ppVar6->second);
        wprintf(L"\n");
        pwVar7 = (wstring *)__cxa_allocate_exception(0x20);
        std::__cxx11::wstring::wstring(pwVar7,(wstring *)strCase);
        __cxa_throw(pwVar7,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
      }
      local_78._M_node =
           (_Base_ptr)
           std::
           map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::
           end(m2);
      bVar5 = std::operator!=(&local_38,&local_78);
      if (bVar5) {
        ResetOutputStream();
        uVar8 = std::__cxx11::wstring::c_str();
        ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&local_38)
        ;
        wVar4 = ppVar6->first;
        ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&local_38)
        ;
        wprintf(L"%ls FAIL\nExpected: none\nActual: (%lc, %d)",uVar8,(ulong)(uint)wVar4,
                (ulong)(uint)ppVar6->second);
        wprintf(L"\n");
        pwVar7 = (wstring *)__cxa_allocate_exception(0x20);
        std::__cxx11::wstring::wstring(pwVar7,(wstring *)strCase);
        __cxa_throw(pwVar7,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
      }
      ResetOutputStream();
      uVar8 = std::__cxx11::wstring::c_str();
      wprintf(L"%ls OK",uVar8);
      wprintf(L"\n");
      return;
    }
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&i2);
    wVar4 = ppVar6->first;
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&local_38);
    if (wVar4 != ppVar6->first) break;
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&i2);
    iVar1 = ppVar6->second;
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&local_38);
    if (iVar1 != ppVar6->second) break;
    local_60 = (_Base_ptr)
               std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator++(&i2,0);
    local_68 = (_Base_ptr)
               std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator++(&local_38,0)
    ;
  }
  ResetOutputStream();
  uVar8 = std::__cxx11::wstring::c_str();
  ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&i2);
  wVar4 = ppVar6->first;
  ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&i2);
  uVar2 = ppVar6->second;
  ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&local_38);
  wVar3 = ppVar6->first;
  ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_wchar_t,_int>_>::operator->(&local_38);
  wprintf(L"%ls FAIL\nExpected: (%lc, %d)\nActual: (%lc, %d)",uVar8,(ulong)(uint)wVar4,(ulong)uVar2,
          (ulong)(uint)wVar3,(ulong)(uint)ppVar6->second);
  wprintf(L"\n");
  pwVar7 = (wstring *)__cxa_allocate_exception(0x20);
  std::__cxx11::wstring::wstring(pwVar7,(wstring *)strCase);
  __cxa_throw(pwVar7,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::map<wchar_t, int> &m1, const std::map<wchar_t, int> &m2) {
  auto i1 = m1.begin();
  auto i2 = m2.begin();

  while (i1 != m1.end() && i2 != m2.end()) {
    if (i1->first != i2->first || i1->second != i2->second) {
      dmpDebug(L"%ls FAIL\nExpected: (%lc, %d)\nActual: (%lc, %d)", dmpPrintable(strCase),
          i1->first, i1->second, i2->first, i2->second);
      throw strCase;
    }
    i1++;
    i2++;
  }

  if (i1 != m1.end()) {
    dmpDebug(L"%ls FAIL\nExpected: (%lc, %d)\nActual: none",
        dmpPrintable(strCase), i1->first, i1->second);
    throw strCase;
  }
  if (i2 != m2.end()) {
    dmpDebug(L"%ls FAIL\nExpected: none\nActual: (%lc, %d)",
        dmpPrintable(strCase), i2->first, i2->second);
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}